

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O1

SymbolInfo * __thiscall
ZXing::Pdf417::ReadSymbolInfo<ZXing::PointT<double>>
          (SymbolInfo *__return_storage_ptr__,Pdf417 *this,
          BitMatrixCursor<ZXing::PointT<double>_> topCur,PointT<double> rowSkip,int colWidth,
          int width,int height)

{
  int iVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  CodeWord CVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  double dVar12;
  int local_e4;
  _Type local_a8;
  PointT<double> local_98;
  undefined1 local_88 [16];
  PatternView local_78;
  BitMatrixCursor<ZXing::PointT<double>_> local_58;
  
  __return_storage_ptr__->width = colWidth;
  __return_storage_ptr__->height = width;
  __return_storage_ptr__->nRows = 0;
  __return_storage_ptr__->nCols = 0;
  __return_storage_ptr__->firstRow = -1;
  __return_storage_ptr__->lastRow = -1;
  __return_storage_ptr__->ecLevel = -1;
  __return_storage_ptr__->rowHeight = 0.0;
  __return_storage_ptr__->colWidth = (int)this;
  dVar2 = topCur.p.x + rowSkip.x * 0.5;
  dVar3 = topCur.p.y + rowSkip.y * 0.5;
  local_e4 = __return_storage_ptr__->nCols;
  iVar8 = __return_storage_ptr__->firstRow;
  iVar1 = __return_storage_ptr__->ecLevel;
  uVar10 = 0;
  local_88._8_4_ = SUB84(dVar3,0);
  local_88._0_8_ = dVar2;
  local_88._12_4_ = (int)((ulong)dVar3 >> 0x20);
  iVar11 = 0;
  iVar9 = 0;
  local_98 = rowSkip;
  do {
    dVar12 = ABS((double)local_88._8_8_ - dVar3);
    if (ABS((double)local_88._8_8_ - dVar3) <= ABS((double)local_88._0_8_ - dVar2)) {
      dVar12 = ABS((double)local_88._0_8_ - dVar2);
    }
    if ((double)(width / 2) <= dVar12) break;
    local_58.img = topCur.img;
    local_58.p.y._0_4_ = SUB84(dVar3,0);
    local_58.p.x = dVar2;
    local_58.p.y._4_4_ = (int)((ulong)dVar3 >> 0x20);
    local_58.d.x = topCur.d.x;
    local_58.d.y = topCur.d.y;
    local_a8 = (_Type)BitMatrixCursor<ZXing::PointT<double>>::
                      readPatternFromBlack<std::array<unsigned_short,8ul>>
                                ((BitMatrixCursor<ZXing::PointT<double>> *)&local_58,1,(int)this + 2
                                );
    local_78._data = local_a8;
    local_78._size = 8;
    local_78._base = (Iterator)0x0;
    local_78._end = (Iterator)0x0;
    dVar12 = IsPattern<false,8,17>(&local_78,(FixedPattern<8,_17,_false> *)START_PATTERN,0,0.0,0.0);
    bVar4 = true;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      CVar6 = ReadCodeWord<ZXing::PointT<double>>(&local_58,-1);
      bVar4 = false;
      if ((ulong)CVar6 >> 0x20 != 0xffffffff) {
        iVar7 = CVar6.code;
        iVar5 = CVar6.cluster;
        if (iVar8 == -1) {
          iVar8 = (int)((ulong)(((long)CVar6 >> 0x20) * -0x77777777) >> 0x20) + iVar7;
          iVar8 = iVar5 / 3 + ((iVar8 >> 4) - (iVar8 >> 0x1f)) * 3;
        }
        if (iVar5 == 6) {
          local_e4 = iVar7 % 0x1e + 1;
        }
        else if (iVar5 == 3) {
          iVar9 = iVar7 % 3;
          iVar1 = (iVar7 % 0x1e) / 3;
        }
        else {
          if (iVar5 != 0) goto LAB_001773f5;
          iVar11 = iVar7 % 0x1e;
        }
        uVar10 = uVar10 | 1 << (iVar5 / 3 & 0x1fU);
        bVar4 = false;
      }
    }
LAB_001773f5:
    if (bVar4) break;
    dVar2 = dVar2 + local_98.x;
    dVar3 = dVar3 + local_98.y;
  } while (uVar10 != 7);
  __return_storage_ptr__->firstRow = iVar8;
  __return_storage_ptr__->nCols = local_e4;
  __return_storage_ptr__->ecLevel = iVar1;
  if ((~uVar10 & 3) == 0) {
    __return_storage_ptr__->nRows = iVar11 * 3 + iVar9 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

SymbolInfo ReadSymbolInfo(BitMatrixCursor<POINT> topCur, POINT rowSkip, int colWidth, int width, int height)
{
	SymbolInfo res = {width, height};
	res.colWidth = colWidth;
	int clusterMask = 0;
	int rows0 = 0, rows1 = 0; // Suppress GNUC -Wmaybe-uninitialized

	topCur.p += .5f * rowSkip;

	for (auto startCur = topCur; clusterMask != 0b111 && maxAbsComponent(topCur.p - startCur.p) < height / 2; startCur.p += rowSkip) {
		auto cur = startCur;
		if (!IsPattern(cur.template readPatternFromBlack<Pattern417>(1, colWidth + 2), START_PATTERN))
			break;
		auto cw = ReadCodeWord(cur);
#ifdef PRINT_DEBUG
		printf("%3dx%3d:%2d: %4d.%d \n", int(cur.p.x), int(cur.p.y), Row(cw), cw.code, cw.cluster);
		fflush(stdout);
#endif
		if (!cw)
			continue;
		if (res.firstRow == -1)
			res.firstRow = Row(cw);
		switch (cw.cluster) {
		case 0: rows0 = cw.code % 30; break;
		case 3: rows1 = cw.code % 3, res.ecLevel = (cw.code % 30) / 3; break;
		case 6: res.nCols = (cw.code % 30) + 1; break;
		default: continue;
		}
		clusterMask |= (1 << cw.cluster / 3);
	}
	if ((clusterMask & 0b11) == 0b11)
		res.nRows = 3 * rows0 + rows1 + 1;
	return res;
}